

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *out_g;
  ImVec2 *out_b;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  undefined1 __src [8];
  ImDrawList *pIVar4;
  undefined4 uVar5;
  uint uVar6;
  ImU32 col_00;
  ImU32 col_01;
  undefined8 extraout_RAX;
  char *text_end;
  char cVar7;
  ulong uVar8;
  uint uVar9;
  ImGuiContext *g;
  byte bVar10;
  undefined7 uVar12;
  ulong uVar11;
  ImVec2 *pIVar13;
  int iVar14;
  ImU32 col_bot_right;
  long lVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  float fVar19;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  ImVec2 IVar20;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  ImVec2 p_min;
  ImVec2 pos;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  int iVar21;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  int iVar22;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar23;
  float fVar24;
  ImVec2 p_max;
  ImVec2 gradient_p1;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 half_sz_00;
  float fVar31;
  uint uVar32;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float local_278;
  float local_274;
  float V;
  uint local_26c;
  ImGuiContext *local_268;
  float local_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  float B;
  float G;
  float R;
  ImVec2 *local_228;
  ImDrawList *local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  ImVec2 local_200;
  ImU32 local_1f4;
  uint local_1f0;
  uint local_1ec;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 local_1c0;
  float local_1b8;
  float fStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  ImVec2 current_off_unrotated;
  float vv;
  float fStack_17c;
  ImVec2 local_178;
  ImVec2 picker_pos;
  float ww;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  ImVec2 tra;
  float uu;
  float fStack_f4;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  size_t local_b8;
  ImGuiWindow *local_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [16];
  ImVec2 trc;
  float backup_initial_col [4];
  ImVec2 uv_white;
  ImVec2 trb;
  undefined1 auVar26 [16];
  
  pIVar2 = GImGui;
  uStack_240 = local_248;
  local_248 = (undefined1  [8])ref_col;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems != false) {
    bVar10 = 0;
    goto LAB_002ec16b;
  }
  local_220 = pIVar1->DrawList;
  local_258._0_4_ = CalcItemWidth();
  local_258._4_4_ = extraout_XMM0_Db;
  fStack_250 = (float)extraout_XMM0_Dc;
  fStack_24c = (float)extraout_XMM0_Dd;
  local_268 = pIVar2;
  (pIVar2->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar9 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar9);
  }
  pIVar2 = local_268;
  if ((flags & 0x6000000U) == 0) {
    uVar6 = local_268->ColorEditOptions & 0x6000000;
    uVar17 = 0x2000000;
    if (uVar6 != 0) {
      uVar17 = uVar6;
    }
    uVar9 = uVar9 | uVar17;
  }
  if ((uVar9 & 0x18000000) == 0) {
    uVar6 = local_268->ColorEditOptions & 0x18000000;
    uVar17 = 0x8000000;
    if (uVar6 != 0) {
      uVar17 = uVar6;
    }
    uVar9 = uVar9 | uVar17;
  }
  uVar17 = (uVar9 & 0x6000000) - 1;
  if ((uVar9 & 0x6000000 ^ uVar17) <= uVar17) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1177,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar17 = (uVar9 & 0x18000000) - 1;
  if ((uVar9 & 0x18000000 ^ uVar17) <= uVar17) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1178,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar9 & 8) == 0) {
    uVar9 = uVar9 | local_268->ColorEditOptions & 0x10000U;
  }
  local_1ec = uVar9 & 0x10002;
  bVar16 = local_1ec == 0x10000;
  IVar20 = (pIVar1->DC).CursorPos;
  local_228 = (ImVec2 *)col;
  picker_pos = IVar20;
  local_b0 = pIVar1;
  local_1b8 = GetFrameHeight();
  pIVar13 = local_228;
  fVar19 = (pIVar2->Style).ItemInnerSpacing.x;
  fVar33 = (float)local_258._0_4_ - (local_1b8 + fVar19) * (float)(byte)(bVar16 + 1);
  uVar17 = -(uint)(fVar33 <= local_1b8);
  fVar31 = (float)(local_258._4_4_ & (uint)extraout_XMM0_Db_00);
  uVar6 = (uint)fStack_250 & extraout_XMM0_Dc_00;
  uVar32 = (uint)fStack_24c & extraout_XMM0_Dd_00;
  fVar23 = (float)(uVar17 & (uint)local_1b8 | ~uVar17 & (uint)fVar33);
  local_b8 = (ulong)((uVar9 & 2) == 0) * 4 + 0xc;
  fStack_1b4 = extraout_XMM0_Db_00;
  uStack_1b0 = extraout_XMM0_Dc_00;
  uStack_1ac = extraout_XMM0_Dd_00;
  memcpy(backup_initial_col,local_228,local_b8);
  local_25c = fVar23 * 0.08;
  local_98 = ZEXT416((uint)(fVar23 * 0.5));
  fVar24 = fVar23 * 0.5 - local_25c;
  _local_c8 = ZEXT416((uint)fVar24);
  fVar33 = IVar20.x;
  local_78._0_4_ = fVar33;
  local_88 = fVar23 + fVar33;
  _local_258 = ZEXT416((uint)(fVar19 + local_88));
  local_200.x = (local_1b8 + fVar23) * 0.5 + fVar33;
  fVar38 = IVar20.y;
  local_200.y = fVar23 * 0.5 + fVar38;
  triangle_pa.x = fVar24 - (float)(int)(fVar23 * 0.027);
  triangle_pa.y = 0.0;
  local_1c0.x = triangle_pa.x * -0.5;
  local_1c0.y = triangle_pa.x * -0.866025;
  local_138._4_4_ = local_200.y;
  local_138._0_4_ = local_200.x;
  fStack_130 = fStack_1b4 * 0.0 + 0.0;
  fStack_12c = fVar31 * 0.0 + 0.0;
  triangle_pc.y = triangle_pa.x * 0.866025;
  local_278 = pIVar13->x;
  local_274 = pIVar13->y;
  V = pIVar13[1].x;
  B = V;
  G = local_274;
  R = local_278;
  triangle_pc.x = local_1c0.x;
  fStack_84 = fVar31;
  uStack_80 = uVar6;
  uStack_7c = uVar32;
  if ((uVar9 >> 0x1b & 1) == 0) {
    if ((uVar9 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_278,local_274,V,&R,&G,&B);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_278,local_274,V,&local_278,&local_274,&V);
  }
  local_218._4_4_ = fStack_1b4;
  local_218._0_4_ = local_1b8 + (float)local_258._0_4_;
  fStack_210 = (float)uStack_1b0;
  fStack_20c = (float)uStack_1ac;
  PushItemFlag(8,true);
  pIVar3 = local_268;
  uVar12 = (undefined7)((ulong)pIVar2 >> 8);
  local_128 = fVar38;
  fStack_124 = fVar38;
  fStack_120 = fVar38;
  fStack_11c = fVar38;
  local_d8 = fVar38;
  fStack_d4 = fVar38;
  fStack_d0 = fVar38;
  fStack_cc = fVar38;
  if ((uVar9 >> 0x1a & 1) == 0) {
    if ((uVar9 >> 0x19 & 1) == 0) {
      uVar8 = 0;
      local_26c = 0;
      uVar11 = 0;
    }
    else {
      current_off_unrotated.y = fVar23;
      current_off_unrotated.x = fVar23;
      InvisibleButton("sv",&current_off_unrotated);
      bVar16 = IsItemActive();
      if (bVar16) {
        auVar25._0_4_ = fVar23 + -1.0;
        IVar20 = (local_268->IO).MousePos;
        auVar35._0_4_ = IVar20.x - fVar33;
        auVar35._4_4_ = IVar20.y - fVar38;
        auVar35._8_8_ = 0;
        auVar25._4_4_ = auVar25._0_4_;
        auVar25._8_4_ = auVar25._0_4_;
        auVar25._12_4_ = auVar25._0_4_;
        auVar35 = divps(auVar35,auVar25);
        fVar33 = auVar35._0_4_;
        fVar24 = auVar35._4_4_;
        iVar14 = -(uint)(1.0 < fVar33);
        iVar18 = -(uint)(1.0 < fVar24);
        auVar27._4_4_ = iVar18;
        auVar27._0_4_ = iVar14;
        auVar27._8_4_ = iVar18;
        auVar27._12_4_ = iVar18;
        auVar26._8_8_ = auVar27._8_8_;
        auVar26._4_4_ = iVar14;
        auVar26._0_4_ = iVar14;
        uVar17 = movmskpd((int)local_268,auVar26);
        local_274 = 1.0;
        if ((uVar17 & 1) == 0) {
          local_274 = fVar33;
        }
        local_274 = (float)(~-(uint)(fVar33 < 0.0) & (uint)local_274);
        fVar33 = 0.0;
        if ((uVar17 & 2) == 0) {
          fVar33 = 1.0 - fVar24;
        }
        V = (float)(-(uint)(fVar24 < 0.0) & 0x3f800000 | ~-(uint)(fVar24 < 0.0) & (uint)fVar33);
        uVar8 = 1;
      }
      else {
        uVar8 = 0;
      }
      if ((uVar9 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      current_off_unrotated.y = local_128;
      current_off_unrotated.x = (float)local_258._0_4_;
      SetCursorScreenPos(&current_off_unrotated);
      current_off_unrotated.y = fVar23;
      current_off_unrotated.x = local_1b8;
      InvisibleButton("hue",&current_off_unrotated);
      bVar16 = IsItemActive();
      if (bVar16) {
        fVar33 = ((local_268->IO).MousePos.y - local_d8) / (fVar23 + -1.0);
        local_278 = 1.0;
        if (fVar33 <= 1.0) {
          local_278 = fVar33;
        }
        local_278 = (float)(~-(uint)(fVar33 < 0.0) & (uint)local_278);
        local_26c = (uint)CONCAT71((int7)((ulong)local_268 >> 8),1);
        uVar11 = CONCAT71(uVar12,1);
      }
      else {
        local_26c = 0;
        uVar11 = uVar8;
      }
    }
  }
  else {
    current_off_unrotated.y = fVar23;
    current_off_unrotated.x = (local_268->Style).ItemInnerSpacing.x + fVar23 + local_1b8;
    InvisibleButton("hsv",&current_off_unrotated);
    bVar16 = IsItemActive();
    if (bVar16) {
      fVar37 = (pIVar3->IO).MouseClickedPos[0].x - (float)local_138._0_4_;
      fVar38 = (pIVar3->IO).MouseClickedPos[0].y - (float)local_138._4_4_;
      fVar24 = (pIVar3->IO).MousePos.x - (float)local_138._0_4_;
      _local_a8 = ZEXT416((uint)fVar24);
      fVar33 = (pIVar3->IO).MousePos.y - (float)local_138._4_4_;
      local_e8 = ZEXT416((uint)fVar38);
      fVar38 = fVar37 * fVar37 + fVar38 * fVar38;
      _local_138 = ZEXT416((uint)fVar37);
      if ((fVar38 < ((float)local_c8._0_4_ + -1.0) * ((float)local_c8._0_4_ + -1.0)) ||
         (((float)local_98._0_4_ + 1.0) * ((float)local_98._0_4_ + 1.0) < fVar38)) {
        local_26c = 0;
      }
      else {
        fVar24 = atan2f(fVar33,fVar24);
        fVar24 = (fVar24 / 3.1415927) * 0.5;
        local_278 = (float)(~-(uint)(fVar24 < 0.0) & (uint)fVar24 |
                           (uint)(fVar24 + 1.0) & -(uint)(fVar24 < 0.0));
        local_26c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      fVar24 = cosf(local_278 * -2.0 * 3.1415927);
      fVar38 = sinf(local_278 * -2.0 * 3.1415927);
      uVar5 = local_138._0_4_;
      local_138._4_4_ = extraout_XMM0_Db_01;
      local_138._0_4_ = fVar38;
      fStack_130 = (float)extraout_XMM0_Dc_01;
      fStack_12c = (float)extraout_XMM0_Dd_01;
      current_off_unrotated.x = fVar24 * (float)uVar5 + -(float)local_e8._0_4_ * fVar38;
      current_off_unrotated.y = fVar38 * (float)uVar5 + fVar24 * (float)local_e8._0_4_;
      bVar16 = ImTriangleContainsPoint(&triangle_pa,&local_1c0,&triangle_pc,&current_off_unrotated);
      if (bVar16) {
        current_off_unrotated.x = fVar24 * (float)local_a8._0_4_ + -fVar33 * (float)local_138._0_4_;
        current_off_unrotated.y = (float)local_138._0_4_ * (float)local_a8._0_4_ + fVar24 * fVar33;
        bVar16 = ImTriangleContainsPoint
                           (&triangle_pa,&local_1c0,&triangle_pc,&current_off_unrotated);
        if (!bVar16) {
          current_off_unrotated =
               ImTriangleClosestPoint(&triangle_pa,&local_1c0,&triangle_pc,&current_off_unrotated);
        }
        ImTriangleBarycentricCoords
                  (&triangle_pa,&local_1c0,&triangle_pc,&current_off_unrotated,&uu,&vv,&ww);
        fVar24 = 1.0 - vv;
        fVar33 = 1.0;
        if (fVar24 <= 1.0) {
          fVar33 = fVar24;
        }
        V = (float)(-(uint)(fVar24 < 0.0001) & 0x38d1b717 | ~-(uint)(fVar24 < 0.0001) & (uint)fVar33
                   );
        fVar24 = uu / V;
        fVar33 = 1.0;
        if (fVar24 <= 1.0) {
          fVar33 = fVar24;
        }
        local_274 = (float)(-(uint)(fVar24 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar24 < 0.0001) & (uint)fVar33);
        uVar8 = 1;
        uVar11 = CONCAT71(uVar12,1);
        pIVar13 = local_228;
      }
      else {
        uVar8 = 0;
        uVar11 = (ulong)local_26c;
      }
    }
    else {
      uVar8 = 0;
      local_26c = 0;
      uVar11 = 0;
    }
    if ((uVar9 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  fVar19 = fVar19 + (float)local_218._0_4_;
  if (local_1ec == 0x10000) {
    current_off_unrotated.y = local_128;
    current_off_unrotated.x = fVar19;
    SetCursorScreenPos(&current_off_unrotated);
    current_off_unrotated.y = fVar23;
    current_off_unrotated.x = local_1b8;
    InvisibleButton("alpha",&current_off_unrotated);
    bVar16 = IsItemActive();
    if (bVar16) {
      fVar24 = ((local_268->IO).MousePos.y - local_d8) / (fVar23 + -1.0);
      fVar33 = 1.0;
      if (fVar24 <= 1.0) {
        fVar33 = fVar24;
      }
      pIVar13[1].y = (float)(-(uint)(fVar24 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar24 < 0.0) & (uint)(1.0 - fVar33));
      uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
    }
  }
  PopItemFlag();
  if ((uVar9 >> 8 & 1) == 0) {
    SameLine(0.0,(local_268->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar9) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar9 >> 8 & 1) != 0) {
      SameLine(0.0,(local_268->Style).ItemInnerSpacing.x);
    }
    TextEx(label,text_end,0);
  }
  if ((uVar9 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    current_off_unrotated = *pIVar13;
    __src = local_248;
    if ((char)uVar9 < '\0') {
      Text("Current");
    }
    IVar20.x = local_1b8 * 3.0;
    IVar20.y = local_1b8 * 2.0;
    uStack_240._0_4_ = local_1b8 * 0.0;
    local_248._0_4_ = IVar20.x;
    local_248._4_4_ = IVar20.y;
    uStack_240._4_4_ = local_1b8 * 0.0;
    ColorButton("##current",(ImVec4 *)&current_off_unrotated,uVar9 & 0x180e0040,IVar20);
    if (__src != (undefined1  [8])0x0) {
      Text("Original");
      _uu = *(undefined8 *)__src;
      local_f0 = *(float *)((long)__src + 8);
      if ((uVar9 & 2) == 0) {
        local_ec = *(float *)((long)__src + 0xc);
      }
      else {
        local_ec = 1.0;
      }
      bVar16 = ColorButton("##original",(ImVec4 *)&uu,uVar9 & 0x180e0040,(ImVec2)local_248);
      if (bVar16) {
        memcpy(pIVar13,(void *)__src,local_b8);
        uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  fVar33 = local_1b8 * 0.2;
  fVar24 = 0.0;
  fVar38 = 0.0;
  fVar37 = 0.0;
  out_g = &pIVar13->y;
  out_b = pIVar13 + 1;
  if (((char)local_26c != '\0') || ((char)uVar8 != '\0')) {
    if ((uVar9 >> 0x1b & 1) == 0) {
      if ((uVar9 >> 0x1c & 1) != 0) {
        pIVar13->x = local_278;
        pIVar13->y = local_274;
        pIVar13[1].x = V;
      }
    }
    else {
      _local_248 = ZEXT416((uint)fVar33);
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_278) & (uint)local_278 |
                        (uint)(local_278 + -1e-05) & -(uint)(1.0 <= local_278)),
                 (float)(~-(uint)(0.0 < local_274) & 0x3727c5ac |
                        (uint)local_274 & -(uint)(0.0 < local_274)),
                 (float)(~-(uint)(0.0 < V) & 0x358637bd | (uint)V & -(uint)(0.0 < V)),&pIVar13->x,
                 out_g,&out_b->x);
      fVar33 = (float)local_248._0_4_;
      fVar24 = (float)local_248._4_4_;
      fVar38 = (float)uStack_240;
      fVar37 = uStack_240._4_4_;
    }
  }
  iVar14 = (int)fVar33;
  iVar18 = (int)fVar24;
  iVar21 = (int)fVar38;
  iVar22 = (int)fVar37;
  if ((uVar9 & 0x20) == 0) {
    local_248._4_4_ = (int)fVar24;
    local_248._0_4_ = (int)fVar33;
    uStack_240._0_4_ = (float)(int)fVar38;
    uStack_240._4_4_ = (float)(int)fVar37;
    uVar11 = uVar11 & 0xffffffff;
    fVar33 = fVar19;
    if (local_1ec != 0x10000) {
      fVar33 = (float)local_258._0_4_;
    }
    PushItemWidth((fVar33 + local_1b8) - (float)local_78._0_4_);
    uVar17 = uVar9 & 0x198e001a;
    cVar7 = '\x01';
    if (((uVar9 >> 0x14 & 1) != 0 || (uVar9 & 0x600000) == 0) &&
       (bVar16 = ColorEdit4("##rgb",&local_228->x,uVar17 | 0x100004), bVar16)) {
      uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
      if (local_268->ActiveId == 0) {
        cVar7 = '\x01';
      }
      else {
        cVar7 = local_268->ActiveIdAllowOverlap;
      }
    }
    if ((uVar9 >> 0x15 & 1) != 0 || (uVar9 & 0x500000) == 0) {
      bVar16 = ColorEdit4("##hsv",&local_228->x,uVar17 | 0x200004);
      uVar11 = CONCAT71((int7)(uVar11 >> 8),(byte)uVar11 | bVar16);
    }
    if ((uVar9 >> 0x16 & 1) != 0 || (uVar9 & 0x300000) == 0) {
      bVar16 = ColorEdit4("##hex",&local_228->x,uVar17 | 0x400004);
      uVar11 = CONCAT71((int7)(uVar11 >> 8),(byte)uVar11 | bVar16);
    }
    PopItemWidth();
    pIVar13 = local_228;
    if ((uVar9 >> 0x1b & 1) != 0 && cVar7 == '\0') {
      ColorConvertRGBtoHSV
                (local_228->x,local_228->y,local_228[1].x,&current_off_unrotated.x,&uu,&vv);
      if ((current_off_unrotated.x <= 0.0) && (0.0 < local_278)) {
        if (0.0 < vv) {
LAB_002eb533:
          if (0.0 < uu) goto LAB_002eb559;
          fVar33 = local_274 * 0.5;
        }
        else {
          if ((V == vv) && (!NAN(V) && !NAN(vv))) goto LAB_002eb533;
          vv = V * 0.5;
          fVar33 = local_274;
        }
        ColorConvertHSVtoRGB(local_278,fVar33,vv,&pIVar13->x,out_g,&out_b->x);
      }
    }
LAB_002eb559:
    iVar14 = local_248._0_4_;
    iVar18 = local_248._4_4_;
    iVar21 = (int)(float)uStack_240;
    iVar22 = (int)uStack_240._4_4_;
  }
  local_a8._4_4_ = (float)iVar18;
  local_a8._0_4_ = (float)iVar14;
  fStack_a0 = (float)iVar21;
  fStack_9c = (float)iVar22;
  if ((char)uVar11 != '\0') {
    if ((uVar9 >> 0x1b & 1) == 0) {
      if ((uVar9 >> 0x1c & 1) != 0) {
        local_278 = pIVar13->x;
        local_274 = pIVar13->y;
        V = pIVar13[1].x;
        ColorConvertHSVtoRGB(local_278,local_274,V,&R,&G,&B);
      }
    }
    else {
      R = pIVar13->x;
      G = pIVar13->y;
      B = pIVar13[1].x;
      ColorConvertRGBtoHSV(R,G,B,&local_278,&local_274,&V);
    }
  }
  pIVar2 = local_268;
  local_ec = (local_268->Style).Alpha;
  fVar33 = 1.0;
  if (local_ec <= 1.0) {
    fVar33 = local_ec;
  }
  iVar14 = (int)((float)(~-(uint)(local_ec < 0.0) & (uint)fVar33) * 255.0 + 0.5);
  uu = 1.0;
  fStack_f4 = 1.0;
  local_f0 = 1.0;
  col_bot_right = iVar14 * 0x1000000;
  local_248 = (undefined1  [8])(CONCAT44(iVar14 << 0x18,iVar14 << 0x18) | 0xffff000000ff);
  uStack_240._0_4_ = (float)(iVar14 << 0x18 | 0xff00);
  uStack_240._4_4_ = (float)(iVar14 << 0x18 | 0xffff00);
  local_128 = (float)(col_bot_right + 0xffffff);
  current_off_unrotated = (ImVec2)(CONCAT44(iVar14 << 0x18,iVar14 << 0x18) | 0xffff000000ff);
  local_e8._0_4_ = col_bot_right + 0x808080;
  ColorConvertHSVtoRGB(local_278,1.0,1.0,&uu,&fStack_f4,&local_f0);
  col_00 = ColorConvertFloat4ToU32((ImVec4 *)&uu);
  fStack_17c = G;
  vv = R;
  local_178.y = (pIVar2->Style).Alpha;
  local_178.x = B;
  col_01 = ColorConvertFloat4ToU32((ImVec4 *)&vv);
  pIVar4 = local_220;
  ww = 0.0;
  fStack_13c = 0.0;
  fVar33 = (float)local_248._0_4_;
  if ((uVar9 >> 0x1a & 1) == 0) {
    if ((uVar9 >> 0x19 & 1) != 0) {
      fStack_17c = local_d8 + fVar23;
      vv = local_88;
      local_1f4 = col_01;
      local_1f0 = (uint)uVar11;
      ImDrawList::AddRectFilledMultiColor
                (local_220,&picker_pos,(ImVec2 *)&vv,(ImU32)local_128,col_00,col_00,(ImU32)local_128
                );
      local_248._4_4_ = fVar23;
      local_248._0_4_ = fVar23;
      uStack_240._0_4_ = fVar23;
      uStack_240._4_4_ = fVar23;
      vv = picker_pos.x + fVar23;
      fStack_17c = picker_pos.y + fVar23;
      ImDrawList::AddRectFilledMultiColor
                (pIVar4,&picker_pos,(ImVec2 *)&vv,0,0,col_bot_right,col_bot_right);
      p_max.x = (float)local_248._0_4_ + picker_pos.x;
      p_max.y = (float)local_248._4_4_ + picker_pos.y;
      RenderFrameBorder(picker_pos,p_max,0.0);
      auVar34._4_4_ = 1.0 - V;
      auVar34._0_4_ = local_274;
      auVar34._8_8_ = 0;
      auVar35 = minps(_DAT_0056e270,auVar34);
      fVar24 = picker_pos.x;
      fVar38 = picker_pos.y;
      auVar28._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_274) & auVar35._0_4_) * (float)local_248._0_4_
                        + fVar24 + 0.5);
      auVar28._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - V) & auVar35._4_4_) * (float)local_248._4_4_ +
                        fVar38 + 0.5);
      auVar28._8_4_ = (float)(int)(auVar35._8_4_ * (float)uStack_240 + 0.0 + 0.0);
      auVar28._12_4_ = (float)(int)(auVar35._12_4_ * uStack_240._4_4_ + 0.0 + 0.0);
      auVar36._0_4_ = (float)local_248._0_4_ + fVar24 + -2.0;
      auVar36._4_4_ = (float)local_248._4_4_ + fVar38 + -2.0;
      auVar36._8_4_ = (float)uStack_240 + 0.0 + 0.0;
      auVar36._12_4_ = uStack_240._4_4_ + 0.0 + 0.0;
      auVar35 = minps(auVar36,auVar28);
      uVar9 = -(uint)(auVar28._0_4_ < fVar24 + 2.0);
      uVar17 = -(uint)(auVar28._4_4_ < fVar38 + 2.0);
      fStack_13c = (float)(~uVar17 & auVar35._4_4_ | (uint)(fVar38 + 2.0) & uVar17);
      ww = (float)(~uVar9 & auVar35._0_4_ | (uint)(fVar24 + 2.0) & uVar9);
      local_248._4_4_ = fVar31;
      local_248._0_4_ = fVar23 / 6.0;
      uStack_240._0_4_ = (float)uVar6;
      uStack_240._4_4_ = (float)uVar32;
      lVar15 = 0;
      while( true ) {
        if (lVar15 == 6) break;
        fStack_17c = (float)(int)lVar15 * (float)local_248._0_4_ + picker_pos.y;
        vv = (float)local_258._0_4_;
        tra.y = (float)(int)(lVar15 + 1) * (float)local_248._0_4_ + picker_pos.y;
        tra.x = (float)local_218._0_4_;
        fVar24 = (&current_off_unrotated.y)[lVar15];
        ImDrawList::AddRectFilledMultiColor
                  (local_220,(ImVec2 *)&vv,&tra,(ImU32)fVar33,(ImU32)fVar33,(ImU32)fVar24,
                   (ImU32)fVar24);
        lVar15 = lVar15 + 1;
        fVar33 = fVar24;
      }
      _local_248 = ZEXT416((uint)(float)(int)(local_278 * fVar23 + picker_pos.y + 0.5));
      p_min.y = picker_pos.y;
      p_min.x = (float)local_258._0_4_;
      p_max_00.y = fVar23 + picker_pos.y;
      p_max_00.x = (float)local_218._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_258._0_4_ + -1.0;
      pos.y = (float)local_248._0_4_;
      half_sz.x = (float)local_a8._0_4_ + 1.0;
      half_sz.y = (float)local_a8._0_4_;
      RenderArrowsForVerticalBar(local_220,pos,half_sz,local_1b8 + 2.0,(local_268->Style).Alpha);
      uVar11 = (ulong)local_1f0;
      col_01 = local_1f4;
    }
  }
  else {
    local_78 = ZEXT416((uint)(0.5 / (float)local_98._0_4_));
    local_88 = 5.60519e-45;
    if (4 < (int)(float)local_98._0_4_ / 0xc) {
      local_88 = (float)((int)(float)local_98._0_4_ / 0xc);
    }
    local_138._4_4_ = 0x80000000;
    local_138._0_4_ = -(0.5 / (float)local_98._0_4_);
    fStack_130 = -0.0;
    fStack_12c = -0.0;
    local_98._0_4_ = (float)local_98._0_4_ + (float)local_c8._0_4_;
    local_d8 = (float)local_98._0_4_ * 0.5;
    local_c8._4_4_ = local_c8._0_4_;
    fStack_c0 = (float)local_c8._0_4_;
    fStack_bc = (float)local_c8._0_4_;
    local_1f4 = col_01;
    local_1f0 = (uint)uVar11;
    for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
      fVar24 = (float)(int)lVar15 / 6.0;
      fVar31 = (fVar24 + fVar24) * 3.1415927 + (float)local_138._0_4_;
      fVar24 = ((float)(int)lVar15 + 1.0) / 6.0;
      fVar24 = (fVar24 + fVar24) * 3.1415927 + (float)local_78._0_4_;
      local_248._0_4_ = fVar24;
      iVar14 = (pIVar4->VtxBuffer).Size;
      ImDrawList::PathArcTo(pIVar4,&local_200,local_d8,fVar31,fVar24,(int)local_88);
      ImDrawList::PathStroke(pIVar4,(ImU32)local_128,false,local_25c);
      iVar18 = (pIVar4->VtxBuffer).Size;
      _local_218 = ZEXT416((uint)local_200.x);
      local_258._0_4_ = cosf(fVar31);
      local_258._4_4_ = extraout_XMM0_Db_02;
      fStack_250 = (float)extraout_XMM0_Dc_02;
      fStack_24c = (float)extraout_XMM0_Dd_02;
      auVar29._4_4_ = local_200.y;
      auVar29._0_4_ = local_218._0_4_;
      auVar29._8_4_ = local_218._4_4_;
      auVar29._12_4_ = 0;
      _local_218 = auVar29;
      fVar24 = sinf(fVar31);
      fVar31 = (float)local_258._4_4_ * fStack_c0;
      local_258._4_4_ = fVar24 * (float)local_c8._4_4_ + (float)local_218._4_4_;
      local_258._0_4_ = (float)local_258._0_4_ * (float)local_c8._0_4_ + (float)local_218._0_4_;
      fStack_250 = fVar31 + fStack_210;
      fStack_24c = extraout_XMM0_Db_03 * fStack_bc + fStack_20c;
      _local_218 = ZEXT416((uint)local_200.x);
      fVar24 = cosf((float)local_248._0_4_);
      auVar30._4_4_ = local_200.y;
      auVar30._0_4_ = local_218._0_4_;
      auVar30._8_4_ = local_218._4_4_;
      auVar30._12_4_ = 0;
      _local_218 = auVar30;
      fVar31 = sinf((float)local_248._0_4_);
      gradient_p1.x = fVar24 * (float)local_c8._0_4_ + (float)local_218._0_4_;
      gradient_p1.y = fVar31 * (float)local_c8._4_4_ + (float)local_218._4_4_;
      fVar24 = (&current_off_unrotated.y)[lVar15];
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar4,iVar14,iVar18,(ImVec2)local_258,gradient_p1,(ImU32)fVar33,(ImU32)fVar24);
      fVar33 = fVar24;
    }
    local_258._0_4_ = cosf((local_278 + local_278) * 3.1415927);
    local_258._4_4_ = extraout_XMM0_Db_04;
    fStack_250 = (float)extraout_XMM0_Dc_03;
    fStack_24c = (float)extraout_XMM0_Dd_03;
    local_218._0_4_ = sinf((local_278 + local_278) * 3.1415927);
    pIVar4 = local_220;
    local_218._4_4_ = extraout_XMM0_Db_05;
    fStack_210 = (float)extraout_XMM0_Dc_04;
    fStack_20c = (float)extraout_XMM0_Dd_04;
    vv = (float)local_258._0_4_ * (float)local_98._0_4_ * 0.5 + local_200.x;
    fStack_17c = (float)local_218._0_4_ * (float)local_98._0_4_ * 0.5 + local_200.y;
    if ((char)local_26c == '\0') {
      fVar33 = 0.55;
    }
    else {
      fVar33 = 0.65;
    }
    local_25c = local_25c * fVar33;
    iVar14 = 0x20;
    if ((int)(local_25c / 1.4) < 0x20) {
      iVar14 = (int)(local_25c / 1.4);
    }
    iVar18 = 9;
    if (9 < iVar14) {
      iVar18 = iVar14;
    }
    ImDrawList::AddCircleFilled(local_220,(ImVec2 *)&vv,local_25c,col_00,iVar18);
    ImDrawList::AddCircle(pIVar4,(ImVec2 *)&vv,local_25c + 1.0,local_e8._0_4_,iVar18,1.0);
    fVar33 = local_128;
    ImDrawList::AddCircle(pIVar4,(ImVec2 *)&vv,local_25c,(ImU32)local_128,iVar18,1.0);
    tra.x = triangle_pa.x * (float)local_258._0_4_ + -triangle_pa.y * (float)local_218._0_4_ +
            local_200.x;
    tra.y = triangle_pa.x * (float)local_218._0_4_ + triangle_pa.y * (float)local_258._0_4_ +
            local_200.y;
    trb.x = local_1c0.x * (float)local_258._0_4_ + -local_1c0.y * (float)local_218._0_4_ +
            local_200.x;
    trb.y = local_1c0.x * (float)local_218._0_4_ + local_1c0.y * (float)local_258._0_4_ +
            local_200.y;
    trc.x = triangle_pc.x * (float)local_258._0_4_ + -triangle_pc.y * (float)local_218._0_4_ +
            local_200.x;
    trc.y = triangle_pc.x * (float)local_218._0_4_ + triangle_pc.y * (float)local_258._0_4_ +
            local_200.y;
    uv_white = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(pIVar4,6,6);
    ImDrawList::PrimVtx(pIVar4,&tra,&uv_white,col_00);
    ImDrawList::PrimVtx(pIVar4,&trb,&uv_white,col_00);
    ImDrawList::PrimVtx(pIVar4,&trc,&uv_white,(ImU32)fVar33);
    ImDrawList::PrimVtx(pIVar4,&tra,&uv_white,0);
    ImDrawList::PrimVtx(pIVar4,&trb,&uv_white,(ImU32)fVar33);
    ImDrawList::PrimVtx(pIVar4,&trc,&uv_white,0);
    ImDrawList::AddTriangle(pIVar4,&tra,&trb,&trc,local_e8._0_4_,1.5);
    fVar33 = 1.0;
    if (local_274 <= 1.0) {
      fVar33 = local_274;
    }
    fVar33 = (float)(~-(uint)(local_274 < 0.0) & (uint)fVar33);
    fVar31 = 1.0 - V;
    fVar24 = 1.0;
    if (fVar31 <= 1.0) {
      fVar24 = fVar31;
    }
    fVar24 = (float)(~-(uint)(fVar31 < 0.0) & (uint)fVar24);
    fVar31 = fVar33 * (tra.x - trc.x) + trc.x;
    fVar33 = fVar33 * (tra.y - trc.y) + trc.y;
    ww = fVar24 * (trb.x - fVar31) + fVar31;
    fStack_13c = fVar24 * (trb.y - fVar33) + fVar33;
    uVar11 = (ulong)local_1f0;
    col_01 = local_1f4;
  }
  pIVar4 = local_220;
  if ((char)uVar8 == '\0') {
    fVar33 = 6.0;
  }
  else {
    fVar33 = 10.0;
  }
  local_258._0_4_ = fVar33;
  ImDrawList::AddCircleFilled(local_220,(ImVec2 *)&ww,fVar33,col_01,0xc);
  ImDrawList::AddCircle(pIVar4,(ImVec2 *)&ww,(float)local_258._0_4_ + 1.0,local_e8._0_4_,0xc,1.0);
  ImDrawList::AddCircle(pIVar4,(ImVec2 *)&ww,(float)local_258._0_4_,(ImU32)local_128,0xc,1.0);
  pIVar13 = local_228;
  if (local_1ec == 0x10000) {
    fVar33 = local_228[1].y;
    _local_218 = ZEXT416((uint)fVar33);
    fVar24 = 1.0;
    if (fVar33 <= 1.0) {
      fVar24 = fVar33;
    }
    _local_258 = ZEXT416((uint)(1.0 - fVar24));
    fStack_17c = picker_pos.y;
    vv = fVar19;
    local_178.x = fVar19 + local_1b8;
    local_178.y = picker_pos.y + fVar23;
    RenderColorRectWithAlphaCheckerboard
              (_vv,local_178,0,(local_178.x - fVar19) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (pIVar4,(ImVec2 *)&vv,&local_178,col_01,col_01,col_01 & 0xffffff,col_01 & 0xffffff);
    local_258._4_4_ = (float)(int)(float)(~local_218._4_4_ & local_258._4_4_);
    local_258._0_4_ =
         (float)(int)((float)(-(uint)((float)local_218._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_218._0_4_ < 0.0) & local_258._0_4_) * fVar23 +
                      picker_pos.y + 0.5);
    fStack_250 = (float)(int)(float)(~(uint)fStack_210 & (uint)fStack_250);
    fStack_24c = (float)(int)(float)(~(uint)fStack_20c & (uint)fStack_24c);
    RenderFrameBorder(_vv,local_178,0.0);
    pos_00.x = fVar19 + -1.0;
    pos_00.y = (float)local_258._0_4_;
    half_sz_00.x = (float)local_a8._0_4_ + 1.0;
    half_sz_00.y = (float)local_a8._0_4_;
    uVar11 = uVar11 & 0xffffffff;
    RenderArrowsForVerticalBar(pIVar4,pos_00,half_sz_00,local_1b8 + 2.0,(local_268->Style).Alpha);
  }
  EndGroup();
  pIVar1 = local_b0;
  if ((char)uVar11 != '\0') {
    iVar14 = bcmp(backup_initial_col,pIVar13,local_b8);
    uVar11 = uVar11 & 0xff;
    if (iVar14 == 0) {
      uVar11 = 0;
    }
  }
  bVar10 = (byte)uVar11;
  if ((uVar11 & 1) != 0) {
    MarkItemEdited((pIVar1->DC).LastItemId);
  }
  PopID();
LAB_002ec16b:
  return (bool)(bVar10 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
    else if (flags & ImGuiColorEditFlags_InputHSV)
        ColorConvertHSVtoRGB(H, S, V, R, G, B);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_white);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}